

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O0

void __thiscall
duckdb::Connection::CreateVectorizedFunction<int,int,int,int>
          (Connection *this,string *name,scalar_function_t *udf_func,LogicalType *varargs)

{
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *in_RCX;
  shared_ptr<duckdb::ClientContext,_true> *in_RDX;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *in_RSI;
  LogicalType *in_stack_00000058;
  ClientContext *in_stack_00000060;
  scalar_function_t *in_stack_00000068;
  string *in_stack_00000070;
  LogicalType local_68 [104];
  
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (in_RSI,in_RCX);
  shared_ptr<duckdb::ClientContext,_true>::operator*(in_RDX);
  duckdb::LogicalType::LogicalType(local_68,(LogicalType *)in_RCX);
  UDFWrapper::RegisterFunction<int,int,int,int>
            (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058);
  duckdb::LogicalType::~LogicalType(local_68);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x50d08c);
  return;
}

Assistant:

void CreateVectorizedFunction(const string &name, scalar_function_t udf_func,
	                              LogicalType varargs = LogicalType::INVALID) {
		UDFWrapper::RegisterFunction<TR, ARGS...>(name, udf_func, *context, std::move(varargs));
	}